

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O3

aspa_record * aspa_array_search(aspa_array *array,uint32_t customer_asn)

{
  uint uVar1;
  aspa_record *paVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  if ((array->size == 0) || (array->capacity == 0)) {
    paVar2 = (aspa_record *)0x0;
  }
  else {
    uVar5 = (ulong)(array->size - 1);
    paVar2 = (aspa_record *)0x0;
    uVar4 = 0;
    do {
      uVar3 = uVar4 + uVar5 >> 1;
      uVar1 = array->data[uVar3].customer_asn;
      if (uVar1 == customer_asn) {
        paVar2 = array->data + uVar3;
        break;
      }
      if (uVar1 < customer_asn) {
        uVar4 = uVar3 + 1;
      }
      else {
        if (uVar4 + uVar5 < 2) break;
        uVar5 = uVar3 - 1;
      }
    } while (uVar4 <= uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return paVar2;
}

Assistant:

struct aspa_record *aspa_array_search(struct aspa_array *array, uint32_t customer_asn)
{
	// if the array is empty we return an error
	if (array->size == 0 || array->capacity == 0)
		return NULL;

	// left and right bound of our search space
	register size_t left = 0;
	register size_t right = array->size - 1;

	// we stop if right and left crossed
	while (left <= right) {
		// current center
		size_t center = (left + right) >> 1;
		uint32_t center_value = array->data[center].customer_asn;

		// success found the value
		if (center_value == customer_asn) {
			return &array->data[center];

			// value should be on the right side
		} else if (center_value < customer_asn) {
			left = center + 1;

			// value should be on the left side
		} else if (center == 0) {
			// value cannot be left of index 0
			return NULL;
		} else {
			right = center - 1;
		}
	}

	// element not found
	return NULL;
}